

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall
enact::OptionalTypename::OptionalTypename
          (OptionalTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *wrappedTypename)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__OptionalTypename_00129a80;
  (this->m_wrappedTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (wrappedTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (wrappedTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  iVar1 = (*((this->m_wrappedTypename)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  std::operator+(&this->m_name,"?",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

OptionalTypename::OptionalTypename(std::unique_ptr<const Typename> wrappedTypename) :
            m_wrappedTypename{std::move(wrappedTypename)},
            m_name{"?" + m_wrappedTypename->name()} {
    }